

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseMangledName(State *state)

{
  bool bVar1;
  State *in_RDI;
  ComplexityGuard guard;
  bool local_2e;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar1) {
    local_2e = false;
  }
  else {
    bVar1 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                              ,(char *)in_RDI);
    local_2e = false;
    if (bVar1) {
      local_2e = ParseEncoding(in_stack_ffffffffffffffe8.state_);
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(local_2e & 1);
}

Assistant:

static bool ParseMangledName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  return ParseTwoCharToken(state, "_Z") && ParseEncoding(state);
}